

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.hpp
# Opt level: O2

void __thiscall
ReadThreadsGraph::ReadThreadsGraph(ReadThreadsGraph *this,SequenceDistanceGraph *sdg,string *_name)

{
  DistanceGraph::DistanceGraph(&this->super_DistanceGraph,sdg,_name);
  (this->thread_info)._M_h._M_buckets = &(this->thread_info)._M_h._M_single_bucket;
  (this->thread_info)._M_h._M_bucket_count = 1;
  (this->thread_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_info)._M_h._M_element_count = 0;
  (this->thread_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->thread_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->node_proximal_nodes)._M_h._M_buckets = &(this->node_proximal_nodes)._M_h._M_single_bucket;
  (this->node_proximal_nodes)._M_h._M_bucket_count = 1;
  (this->node_proximal_nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node_proximal_nodes)._M_h._M_element_count = 0;
  (this->node_proximal_nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->node_proximal_nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node_proximal_nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit ReadThreadsGraph(SequenceDistanceGraph & sdg,const std::string &_name="RTG"): DistanceGraph(sdg,_name) {}